

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O2

int xferinfo_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
               curl_off_t ulnow)

{
  ulong uVar1;
  int iVar2;
  
  *(curl_off_t *)((long)clientp + 400) = dltotal;
  *(curl_off_t *)((long)clientp + 0x198) = dlnow;
  *(curl_off_t *)((long)clientp + 0x1a0) = ultotal;
  *(curl_off_t *)((long)clientp + 0x1a8) = ulnow;
  if ((*(byte *)((long)clientp + 0x1d8) & 0x10) == 0) {
    uVar1 = *(ulong *)(*(long *)((long)clientp + 0x10) + 0x4d4);
    iVar2 = 0;
    if (((uint)uVar1 >> 0x1d & 1) != 0) {
      *(ulong *)(*(long *)((long)clientp + 0x10) + 0x4d4) = uVar1 & 0xffffffffdfffffff;
      iVar2 = 0;
      curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int xferinfo_cb(void *clientp,
                curl_off_t dltotal,
                curl_off_t dlnow,
                curl_off_t ultotal,
                curl_off_t ulnow)
{
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  per->dltotal = dltotal;
  per->dlnow = dlnow;
  per->ultotal = ultotal;
  per->ulnow = ulnow;

  if(per->abort)
    return 1;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}